

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O1

void __thiscall FIX::DataDictionary::addField(DataDictionary *this,int field)

{
  iterator __position;
  int local_c;
  
  local_c = field;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             (this + 0xf8),&local_c);
  __position._M_current = *(int **)(this + 0x130);
  if (__position._M_current == *(int **)(this + 0x138)) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)(this + 0x128),__position,&local_c);
  }
  else {
    *__position._M_current = local_c;
    *(int **)(this + 0x130) = __position._M_current + 1;
  }
  return;
}

Assistant:

void addField(int field) {
    m_fields.insert(field);
    m_orderedFields.push_back(field);
  }